

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall tetgenmesh::checkregular(tetgenmesh *this,int type)

{
  memorypool *pmVar1;
  void **ppvVar2;
  ulong uVar3;
  tetrahedron pb;
  tetrahedron pa;
  tetrahedron pc;
  tetrahedron pd;
  tetrahedron pe;
  tetrahedron *pppdVar4;
  tetrahedron *pppdVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  int (*paiVar9) [12];
  char *pcVar10;
  long lVar11;
  double dVar12;
  uint local_58;
  int local_54;
  ulong local_50;
  
  pcVar8 = "regular";
  if (this->b->quiet == 0) {
    pcVar10 = "regular";
    if ((type & 2U) == 0) {
      pcVar10 = "Delaunay";
    }
    pcVar7 = "(s)";
    if ((type & 1U) == 0) {
      pcVar7 = " ";
    }
    printf("  Checking %s %s property of the mesh...\n",pcVar10,pcVar7);
  }
  pmVar1 = this->tetrahedrons;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  pppdVar4 = tetrahedrontraverse(this);
  if (pppdVar4 == (tetrahedron *)0x0) {
    if (this->b->quiet != 0) {
      return 0;
    }
  }
  else {
    if ((type & 2U) == 0) {
      pcVar8 = "Delaunay";
    }
    local_58 = 0;
    local_54 = 0;
    local_50 = 0;
    do {
      paiVar9 = fsymtbl;
      lVar11 = 0;
      do {
        uVar3 = *(ulong *)((long)pppdVar4 + lVar11 * 2);
        pppdVar5 = (tetrahedron *)(uVar3 & 0xfffffffffffffff0);
        if (pppdVar4 < pppdVar5 && pppdVar5[7] != (tetrahedron)this->dummypoint) {
          pb = pppdVar4[*(int *)((long)orgpivot + lVar11)];
          pa = pppdVar4[*(int *)((long)destpivot + lVar11)];
          pc = pppdVar4[*(int *)((long)apexpivot + lVar11)];
          pd = pppdVar4[*(int *)((long)oppopivot + lVar11)];
          pe = pppdVar5[oppopivot[(*paiVar9)[(uint)uVar3 & 0xf]]];
          if (type == 2) {
            dVar12 = orient4d((double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe,
                              (double)pa[3],(double)pb[3],(double)pc[3],(double)pd[3],(double)pe[3])
            ;
          }
          else if (type == 1) {
            dVar12 = insphere_s(this,(double *)pa,(double *)pb,(double *)pc,(double *)pd,
                                (double *)pe);
          }
          else if (type == 0) {
            dVar12 = insphere((double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe);
          }
          else {
            dVar12 = orient4d_s(this,(double *)pa,(double *)pb,(double *)pc,(double *)pd,
                                (double *)pe,(double)pa[3],(double)pb[3],(double)pc[3],(double)pd[3]
                                ,(double)pe[3]);
          }
          if (0.0 < dVar12) {
            local_54 = local_54 + 1;
            if (this->checksubfaceflag == 0) {
LAB_0014a112:
              if (local_50 != 0) goto LAB_0014a163;
            }
            else if (pppdVar4[9] != (tetrahedron)0x0) {
              local_50 = *(ulong *)((long)pppdVar4[9] + lVar11 * 2) & 0xfffffffffffffff8;
              goto LAB_0014a112;
            }
            lVar6 = (long)this->pointmarkindex;
            printf("  !! Non-locally %s (%d, %d, %d) - %d, %d\n",pcVar8,
                   (ulong)*(uint *)((long)pb + lVar6 * 4),(ulong)*(uint *)((long)pa + lVar6 * 4),
                   (ulong)*(uint *)((long)pc + lVar6 * 4),(ulong)*(uint *)((long)pd + lVar6 * 4),
                   *(undefined4 *)((long)pe + lVar6 * 4));
            local_58 = local_58 + 1;
            local_50 = 0;
          }
        }
LAB_0014a163:
        lVar11 = lVar11 + 4;
        paiVar9 = paiVar9 + 1;
      } while (lVar11 != 0x10);
      pppdVar4 = tetrahedrontraverse(this);
    } while (pppdVar4 != (tetrahedron *)0x0);
    if (local_58 != 0) {
      pcVar8 = "regular";
      if ((type & 2U) == 0) {
        pcVar8 = "Delaunay";
      }
      printf("  !! !! !! !! Found %d non-%s faces.\n",(ulong)local_58,pcVar8);
      return local_58;
    }
    pcVar8 = "regular";
    if (this->b->quiet != 0) {
      return 0;
    }
    if (0 < local_54) {
      if ((type & 2U) == 0) {
        pcVar8 = "Delaunay";
      }
      pcVar10 = "  The mesh is constrained %s.\n";
      goto LAB_0014a211;
    }
  }
  pcVar8 = "regular";
  if ((type & 2U) == 0) {
    pcVar8 = "Delaunay";
  }
  pcVar10 = "  The mesh is %s.\n";
LAB_0014a211:
  printf(pcVar10,pcVar8);
  return 0;
}

Assistant:

int tetgenmesh::checkregular(int type)
{
  triface tetloop;
  triface symtet;
  face checksh;
  point p[5];
  REAL sign;
  int ndcount; // Count the non-locally Delaunay faces.
  int horrors;

  if (!b->quiet) {
    printf("  Checking %s %s property of the mesh...\n",
           (type & 2) == 0 ? "Delaunay" : "regular",
           (type & 1) == 0 ? " " : "(s)");
  }

  // Make sure orient3d(p[1], p[0], p[2], p[3]) > 0;
  //   Hence if (insphere(p[1], p[0], p[2], p[3], p[4]) > 0) means that
  //     p[4] lies inside the circumsphere of p[1], p[0], p[2], p[3].
  //   The same if orient4d(p[1], p[0], p[2], p[3], p[4]) > 0 means that
  //     p[4] lies below the oriented hyperplane passing through 
  //     p[1], p[0], p[2], p[3].

  ndcount = 0;
  horrors = 0;
  tetloop.ver = 0;
  // Run through the list of triangles, checking each one.
  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  while (tetloop.tet != (tetrahedron *) NULL) {
    // Check all four faces of the tetrahedron.
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      fsym(tetloop, symtet);
      // Only do test if its adjoining tet is not a hull tet or its pointer
      //   is larger (to ensure that each pair isn't tested twice).
      if (((point) symtet.tet[7] != dummypoint)&&(tetloop.tet < symtet.tet)) {
        p[0] = org(tetloop);   // pa
        p[1] = dest(tetloop);  // pb
        p[2] = apex(tetloop);  // pc
        p[3] = oppo(tetloop);  // pd
        p[4] = oppo(symtet);   // pe

        if (type == 0) {
          sign = insphere(p[1], p[0], p[2], p[3], p[4]);
        } else if (type == 1) {
          sign = insphere_s(p[1], p[0], p[2], p[3], p[4]);
        } else if (type == 2) {
          sign = orient4d(p[1],    p[0],    p[2],    p[3],    p[4], 
                          p[1][3], p[0][3], p[2][3], p[3][3], p[4][3]);
        } else { // type == 3
          sign = orient4d_s(p[1],    p[0],    p[2],    p[3],    p[4], 
                            p[1][3], p[0][3], p[2][3], p[3][3], p[4][3]);
        }

        if (sign > 0.0) {
          ndcount++;
          if (checksubfaceflag) {
            tspivot(tetloop, checksh);
          }
          if (checksh.sh == NULL) {
            printf("  !! Non-locally %s (%d, %d, %d) - %d, %d\n",
                   (type & 2) == 0 ? "Delaunay" : "regular",
		   pointmark(p[0]), pointmark(p[1]), pointmark(p[2]), 
                   pointmark(p[3]), pointmark(p[4]));
            horrors++;
          }
        }
      }
    }
    tetloop.tet = tetrahedrontraverse();
  }

  if (horrors == 0) {
    if (!b->quiet) {
      if (ndcount > 0) {
        printf("  The mesh is constrained %s.\n",
               (type & 2) == 0 ? "Delaunay" : "regular");
      } else {
        printf("  The mesh is %s.\n", (type & 2) == 0 ? "Delaunay" : "regular");
      } 
    }
  } else {
    printf("  !! !! !! !! Found %d non-%s faces.\n", horrors,
           (type & 2) == 0 ? "Delaunay" : "regular");
  }

  return horrors;
}